

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_46dcfc::TransformSelectorFor::Validate(TransformSelectorFor *this,size_t count)

{
  int iVar1;
  transform_error *this_00;
  iterator __first;
  iterator __last;
  anon_class_16_2_032a3561 __gen;
  int local_b4;
  int step;
  int start;
  int size;
  cmAlphaNum local_68;
  string local_38;
  size_t local_18;
  size_t count_local;
  TransformSelectorFor *this_local;
  
  local_18 = count;
  count_local = (size_t)this;
  iVar1 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Start,count);
  this->Start = iVar1;
  iVar1 = TransformSelectorIndexes::NormalizeIndex
                    (&this->super_TransformSelectorIndexes,this->Stop,local_18);
  this->Stop = iVar1;
  if (this->Stop < this->Start) {
    start._3_1_ = 1;
    this_00 = (transform_error *)__cxa_allocate_exception(0x10);
    cmAlphaNum::cmAlphaNum
              (&local_68,
               "sub-command TRANSFORM, selector FOR expects <start> to be no greater than <stop> (")
    ;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&size,this->Start);
    cmStrCat<char[4],int,char[2]>
              (&local_38,&local_68,(cmAlphaNum *)&size,(char (*) [4])" > ",&this->Stop,
               (char (*) [2])0xbfe14a);
    transform_error::transform_error(this_00,&local_38);
    start._3_1_ = 0;
    __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
                transform_error::~transform_error);
  }
  step = ((this->Stop - this->Start) + 1) / this->Step;
  if (((this->Stop - this->Start) + 1) % this->Step != 0) {
    step = step + 1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->super_TransformSelectorIndexes).Indexes,(long)step);
  local_b4 = this->Start;
  iVar1 = this->Step;
  __first = std::vector<int,_std::allocator<int>_>::begin
                      (&(this->super_TransformSelectorIndexes).Indexes);
  __last = std::vector<int,_std::allocator<int>_>::end
                     (&(this->super_TransformSelectorIndexes).Indexes);
  __gen.step = iVar1;
  __gen.start = &local_b4;
  __gen._12_4_ = 0;
  std::
  generate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(anonymous_namespace)::TransformSelectorFor::Validate(unsigned_long)::_lambda()_1_>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             __gen);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    this->Start = this->NormalizeIndex(this->Start, count);
    this->Stop = this->NormalizeIndex(this->Stop, count);

    // Does stepping move us further from the end?
    if (this->Start > this->Stop) {
      throw transform_error(
        cmStrCat("sub-command TRANSFORM, selector FOR "
                 "expects <start> to be no greater than <stop> (",
                 this->Start, " > ", this->Stop, ")"));
    }

    // compute indexes
    auto size = (this->Stop - this->Start + 1) / this->Step;
    if ((this->Stop - this->Start + 1) % this->Step != 0) {
      size += 1;
    }

    this->Indexes.resize(size);
    auto start = this->Start;
    auto step = this->Step;
    std::generate(this->Indexes.begin(), this->Indexes.end(),
                  [&start, step]() -> int {
                    auto r = start;
                    start += step;
                    return r;
                  });

    return true;
  }